

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flstring.c
# Opt level: O0

size_t fl_strlcpy(char *dst,char *src,size_t size)

{
  size_t local_28;
  size_t srclen;
  size_t size_local;
  char *src_local;
  char *dst_local;
  
  local_28 = strlen(src);
  if (size - 1 < local_28) {
    local_28 = size - 1;
  }
  memcpy(dst,src,local_28);
  dst[local_28] = '\0';
  return local_28;
}

Assistant:

size_t				/* O - Length of string */
fl_strlcpy(char       *dst,	/* O - Destination string */
           const char *src,	/* I - Source string */
	   size_t      size) {	/* I - Size of destination string buffer */
  size_t	srclen;		/* Length of source string */


 /*
  * Figure out how much room is needed...
  */

  size --;

  srclen = strlen(src);

 /*
  * Copy the appropriate amount...
  */

  if (srclen > size) srclen = size;

  memcpy(dst, src, srclen);
  dst[srclen] = '\0';

  return (srclen);
}